

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleGetTexLevelParameterifvTests.cpp
# Opt level: O0

void __thiscall
glcts::MultisampleTextureGetTexLevelParametervNegativeLodIsRejectedTest::
MultisampleTextureGetTexLevelParametervNegativeLodIsRejectedTest
          (MultisampleTextureGetTexLevelParametervNegativeLodIsRejectedTest *this,Context *context)

{
  Context *context_local;
  MultisampleTextureGetTexLevelParametervNegativeLodIsRejectedTest *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"negative_lod_is_rejected_test",
             "Verifies glGetTexLevelParameter{if}v() rejects negative <lod> by generating GL_INVALID_VALUE error."
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultisampleTextureGetTexLevelParametervNegativeLodIsRejectedTest_0326c080
  ;
  this->float_data = 0.0;
  this->int_data = 0;
  this->to_id = 0;
  return;
}

Assistant:

MultisampleTextureGetTexLevelParametervNegativeLodIsRejectedTest::
	MultisampleTextureGetTexLevelParametervNegativeLodIsRejectedTest(Context& context)
	: TestCase(context, "negative_lod_is_rejected_test", "Verifies glGetTexLevelParameter{if}v() rejects negative "
														 "<lod> by generating GL_INVALID_VALUE error.")
	, float_data(0.0f)
	, int_data(0)
	, to_id(0)
{
	/* Left blank on purpose */
}